

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O2

send_result_t
zmq::send_multipart<std::initializer_list<zmq::const_buffer>,void>
          (socket_ref s,initializer_list<zmq::const_buffer> *msgs,send_flags flags)

{
  undefined4 in_register_00000014;
  ulong uVar1;
  ulong extraout_RDX;
  undefined8 uVar2;
  _Storage<unsigned_long,_true> _Var3;
  int in_R8D;
  iterator pcVar4;
  _Storage<unsigned_long,_true> _Var5;
  long lVar6;
  send_result_t sVar7;
  socket_base local_38;
  
  uVar1 = CONCAT44(in_register_00000014,flags);
  pcVar4 = msgs->_M_array;
  _Var3._M_value = msgs->_M_len & 0xfffffffffffffff;
  lVar6 = msgs->_M_len << 4;
  _Var5._M_value = 0;
  local_38 = s.super_socket_base._handle;
  do {
    if (lVar6 == 0) {
      uVar2 = CONCAT71((int7)(uVar1 >> 8),1);
LAB_00142202:
      sVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
      sVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var3._M_value;
      return (send_result_t)
             sVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
    detail::socket_base::send
              (&local_38,(int)pcVar4->_data,(void *)pcVar4->_size,
               (ulong)((uint)(lVar6 != 0x10) * 2 | flags),in_R8D);
    if ((extraout_RDX & 1) == 0) {
      if (pcVar4 != msgs->_M_array) {
        __assert_fail("it == begin(msgs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                      ,0xf1,
                      "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::initializer_list<zmq::const_buffer>]"
                     );
      }
      uVar2 = 0;
      _Var3 = _Var5;
      goto LAB_00142202;
    }
    pcVar4 = pcVar4 + 1;
    _Var5._M_value = _Var5._M_value + 1;
    lVar6 = lVar6 + -0x10;
    uVar1 = extraout_RDX;
  } while( true );
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}